

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

int lua_getstack(lua_State *L,int level,lua_Debug *ar)

{
  int iVar1;
  int *piVar2;
  CallInfo *pCVar3;
  bool bVar4;
  uint uVar5;
  CallInfo **ppCVar6;
  
  if (level < 0) {
    uVar5 = 0;
  }
  else {
    piVar2 = *(int **)&L[-1].hookmask;
    iVar1 = *piVar2;
    *piVar2 = iVar1 + 1;
    if (iVar1 != 0) {
      __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                    ,0x79,"int lua_getstack(lua_State *, int, lua_Debug *)");
    }
    ppCVar6 = &L->ci;
    while( true ) {
      pCVar3 = *ppCVar6;
      if ((level == 0) || (pCVar3 == &L->base_ci)) break;
      ppCVar6 = &pCVar3->previous;
      level = level + -1;
    }
    bVar4 = level == 0 && pCVar3 != &L->base_ci;
    if (bVar4) {
      ar->i_ci = pCVar3;
    }
    uVar5 = (uint)bVar4;
    *piVar2 = 0;
  }
  return uVar5;
}

Assistant:

LUA_API int lua_getstack (lua_State *L, int level, lua_Debug *ar) {
  int status;
  CallInfo *ci;
  if (level < 0) return 0;  /* invalid (negative) level */
  lua_lock(L);
  for (ci = L->ci; level > 0 && ci != &L->base_ci; ci = ci->previous)
    level--;
  if (level == 0 && ci != &L->base_ci) {  /* level found? */
    status = 1;
    ar->i_ci = ci;
  }
  else status = 0;  /* no such level */
  lua_unlock(L);
  return status;
}